

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O2

void __thiscall ON_SHA1::AccumulateDoubleArray(ON_SHA1 *this,size_t count,double *a)

{
  double *pdVar1;
  double v;
  
  if (a != (double *)0x0 && count != 0) {
    pdVar1 = a + count;
    for (; a < pdVar1; a = a + 1) {
      v = (double)(~-(ulong)(*a == 0.0) & (ulong)*a);
      Internal_SwapBigEndianUpdate(this,&v,8);
    }
  }
  return;
}

Assistant:

void ON_SHA1::AccumulateDoubleArray(
  size_t count,
  const double* a
)
{
  if (count > 0 && nullptr != a)
  {
    double x, v;
    const double* a1 = a+count;
    while( a < a1)
    {
      x = *a++;
      v = (0.0 == x ? 0.0 : x);
      Internal_SwapBigEndianUpdate( &v, sizeof(v) );
    }
  }
}